

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::update_child(Fl_Group *this,Fl_Widget *widget)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int y;
  int w;
  int h;
  Fl_Widget *widget_local;
  Fl_Group *this_local;
  
  uVar1 = Fl_Widget::damage(widget);
  if (uVar1 != '\0') {
    uVar3 = Fl_Widget::visible(widget);
    if (uVar3 != 0) {
      bVar2 = Fl_Widget::type(widget);
      if (bVar2 < 0xf0) {
        iVar4 = Fl_Widget::x(widget);
        y = Fl_Widget::y(widget);
        w = Fl_Widget::w(widget);
        h = Fl_Widget::h(widget);
        iVar4 = fl_not_clipped(iVar4,y,w,h);
        if (iVar4 != 0) {
          (*widget->_vptr_Fl_Widget[2])();
          Fl_Widget::clear_damage(widget,'\0');
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Group::update_child(Fl_Widget& widget) const {
  if (widget.damage() && widget.visible() && widget.type() < FL_WINDOW &&
      fl_not_clipped(widget.x(), widget.y(), widget.w(), widget.h())) {
    widget.draw();	
    widget.clear_damage();
  }
}